

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

void __thiscall Catch::ColourImpl::ColourGuard::engageImpl(ColourGuard *this,ostream *stream)

{
  int iVar1;
  undefined4 extraout_var;
  
  iVar1 = (*this->m_colourImpl->m_stream->_vptr_IStream[2])();
  if ((ostream *)CONCAT44(extraout_var,iVar1) == stream) {
    this->m_engaged = true;
    (*this->m_colourImpl->_vptr_ColourImpl[2])(this->m_colourImpl,(ulong)this->m_code);
    return;
  }
  __assert_fail("&stream == &m_colourImpl->m_stream->stream() && \"Engaging colour guard for different stream than used by the \" \"parent colour implementation\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.cpp"
                ,0xc88,"void Catch::ColourImpl::ColourGuard::engageImpl(std::ostream &)");
}

Assistant:

void ColourImpl::ColourGuard::engageImpl( std::ostream& stream ) {
        assert( &stream == &m_colourImpl->m_stream->stream() &&
                "Engaging colour guard for different stream than used by the "
                "parent colour implementation" );
        static_cast<void>( stream );

        m_engaged = true;
        m_colourImpl->use( m_code );
    }